

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleUseIntrinsic(cmFortranParser *parser,char *module_name)

{
  long lVar1;
  value_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *mod_name;
  char *module_name_local;
  cmFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    mod_name = (string *)module_name;
    module_name_local = (char *)parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,module_name,&local_61);
    cmsys::SystemTools::LowerCase(&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    local_20 = &local_40;
    lVar1 = *(long *)(module_name_local + 0x1a0);
    cmFortranParser_s::ModName((string *)&local_98,(cmFortranParser_s *)module_name_local,local_20);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
              *)(lVar1 + 0x80),&local_98,__x);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void cmFortranParser_RuleUseIntrinsic(cmFortranParser* parser,
                                      const char* module_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // syntax:   "use, intrinsic:: module_name"
  // requires: "module_name.mod"
  std::string const& mod_name = cmSystemTools::LowerCase(module_name);
  parser->Info.Intrinsics.insert(parser->ModName(mod_name));
}